

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_jsonmodelserialiser.cpp
# Opt level: O3

int __thiscall JsonModelSerialiser::qt_metacall(JsonModelSerialiser *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  
  _id_00 = AbstractStringSerialiser::qt_metacall(&this->super_AbstractStringSerialiser,_c,_id,_a);
  if (-1 < (int)_id_00) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (_id_00 < 4) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) {
        return _id_00;
      }
      if (_id_00 < 4) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
      }
    }
    _id_00 = _id_00 - 4;
  }
  return _id_00;
}

Assistant:

int JsonModelSerialiser::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = AbstractStringSerialiser::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 4;
    }
    return _id;
}